

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Contains * __thiscall
Catch::Matchers::Impl::StdString::Contains::toString_abi_cxx11_(Contains *this)

{
  string local_38 [40];
  Contains *this_local;
  
  this_local = this;
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"contains: \""
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

virtual std::string toString() const {
                return "contains: \"" + m_substr + "\"";
            }